

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O0

double inform_shannon_pre(inform_dist *p,inform_dist *q,size_t event,double base)

{
  _Bool _Var1;
  double dVar2;
  double dVar3;
  double v;
  double u;
  double base_local;
  size_t event_local;
  inform_dist *q_local;
  inform_dist *p_local;
  
  _Var1 = inform_dist_is_valid(p);
  if (((_Var1) && (_Var1 = inform_dist_is_valid(q), _Var1)) && (p->size == q->size)) {
    dVar2 = inform_dist_prob(p,event);
    dVar3 = inform_dist_prob(q,event);
    dVar2 = log2(dVar2 / dVar3);
    dVar3 = log2(base);
    p_local = (inform_dist *)(dVar2 / dVar3);
  }
  else {
    p_local = (inform_dist *)0x7ff8000000000000;
  }
  return (double)p_local;
}

Assistant:

double inform_shannon_pre(inform_dist const *p, inform_dist const *q,
    size_t event, double base)
{
    if (inform_dist_is_valid(p) && inform_dist_is_valid(q) && p->size == q->size)
    {
        double u = inform_dist_prob(p, event);
        double v = inform_dist_prob(q, event);
        return log2(u/v) / log2(base);
    }
    return NAN;
}